

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O3

string * dto::pretty_payload(string *__return_storage_ptr__,string *pld)

{
  long lVar1;
  string short_pld;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__cxx11::string::substr((ulong)&local_38,(ulong)pld);
  if (local_30 != 0) {
    lVar1 = 0;
    do {
      if (*(char *)((long)local_38 + lVar1) == '\n') {
        *(undefined1 *)((long)local_38 + lVar1) = 0x7c;
      }
      lVar1 = lVar1 + 1;
    } while (local_30 != lVar1);
    if (local_30 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00126b58;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,local_38);
LAB_00126b58:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string pretty_payload(const std::string &pld) {
  std::string short_pld = pld.substr(0, 20);
  std::replace(short_pld.begin(), short_pld.end(), '\n', '|');
  return short_pld.empty() ? short_pld : short_pld + "...";
}